

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

Type * __thiscall slang::ast::Type::getArrayElementType(Type *this)

{
  Type *pTVar1;
  PackedArrayType *pPVar2;
  FixedSizeUnpackedArrayType *pFVar3;
  DynamicArrayType *pDVar4;
  DPIOpenArrayType *pDVar5;
  AssociativeArrayType *pAVar6;
  QueueType *pQVar7;
  Type *t;
  Type *in_stack_ffffffffffffffe0;
  Type *local_8;
  
  pTVar1 = getCanonicalType(in_stack_ffffffffffffffe0);
  switch((pTVar1->super_Symbol).kind) {
  case PackedArrayType:
    pPVar2 = Symbol::as<slang::ast::PackedArrayType>((Symbol *)0x4e3171);
    local_8 = pPVar2->elementType;
    break;
  case FixedSizeUnpackedArrayType:
    pFVar3 = Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)0x4e3186);
    local_8 = pFVar3->elementType;
    break;
  case DynamicArrayType:
    pDVar4 = Symbol::as<slang::ast::DynamicArrayType>((Symbol *)0x4e319b);
    local_8 = pDVar4->elementType;
    break;
  case DPIOpenArrayType:
    pDVar5 = Symbol::as<slang::ast::DPIOpenArrayType>((Symbol *)0x4e31b0);
    local_8 = pDVar5->elementType;
    break;
  case AssociativeArrayType:
    pAVar6 = Symbol::as<slang::ast::AssociativeArrayType>((Symbol *)0x4e31c5);
    local_8 = pAVar6->elementType;
    break;
  case QueueType:
    pQVar7 = Symbol::as<slang::ast::QueueType>((Symbol *)0x4e31da);
    local_8 = pQVar7->elementType;
    break;
  default:
    local_8 = (Type *)0x0;
  }
  return local_8;
}

Assistant:

const Type* Type::getArrayElementType() const {
    const Type& t = getCanonicalType();
    switch (t.kind) {
        case SymbolKind::PackedArrayType:
            return &t.as<PackedArrayType>().elementType;
        case SymbolKind::FixedSizeUnpackedArrayType:
            return &t.as<FixedSizeUnpackedArrayType>().elementType;
        case SymbolKind::DynamicArrayType:
            return &t.as<DynamicArrayType>().elementType;
        case SymbolKind::DPIOpenArrayType:
            return &t.as<DPIOpenArrayType>().elementType;
        case SymbolKind::AssociativeArrayType:
            return &t.as<AssociativeArrayType>().elementType;
        case SymbolKind::QueueType:
            return &t.as<QueueType>().elementType;
        default:
            return nullptr;
    }
}